

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileCollider.cpp
# Opt level: O3

bool __thiscall
solitaire::colliders::StockPileCollider::uncoveredCardsCollidesWith
          (StockPileCollider *this,Position *position)

{
  int iVar1;
  uint extraout_var;
  int extraout_var_00;
  
  (*(this->stockPile->super_Archiver)._vptr_Archiver[7])();
  if ((((extraout_var & 1) != 0) &&
      (iVar1 = (*(this->super_StockPileCollider)._vptr_StockPileCollider[5])(this),
      position->x < iVar1 + 0x4b && iVar1 <= position->x)) && (extraout_var_00 <= position->y)) {
    return position->y < extraout_var_00 + 0x68;
  }
  return false;
}

Assistant:

bool StockPileCollider::uncoveredCardsCollidesWith(const Position& position) const {
    if (not stockPile.getSelectedCardIndex()) return false;
    const auto cardsPosition = getUncoveredCardsPosition();
    return cardCollidesWith(cardsPosition, position);
}